

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

void __thiscall deci::ast_t::~ast_t(ast_t *this)

{
  bool bVar1;
  reference ppaVar2;
  ast_item_t *item;
  iterator __end1;
  iterator __begin1;
  vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_> *__range1;
  ast_t *this_local;
  
  __end1 = std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>::begin
                     (&this->statements);
  item = (ast_item_t *)
         std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>::end
                   (&this->statements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<deci::ast_item_t_**,_std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>_>
                                *)&item);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<deci::ast_item_t_**,_std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>_>
              ::operator*(&__end1);
    if (*ppaVar2 != (ast_item_t *)0x0) {
      (*(*ppaVar2)->_vptr_ast_item_t[4])();
    }
    __gnu_cxx::
    __normal_iterator<deci::ast_item_t_**,_std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>::~vector(&this->statements);
  ast_item_t::~ast_item_t(&this->super_ast_item_t);
  return;
}

Assistant:

ast_t::~ast_t() {
    for (auto item: this->statements) {
      delete item;
    }
  }